

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

int mecab_do(int argc,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  ModelImpl *pMVar8;
  ulong uVar9;
  undefined4 extraout_var;
  void *pvVar10;
  int *piVar11;
  undefined4 extraout_var_00;
  Tagger *pTVar12;
  size_type sVar13;
  istream *piVar14;
  reference pvVar15;
  long *plVar16;
  char *__src;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int __oflag;
  int in_ESI;
  uint in_EDI;
  char *r;
  scoped_fixed_array<char,_8192> line;
  string sentence;
  istream_wrapper ifs;
  size_t i;
  scoped_ptr<MeCab::Tagger> tagger;
  char *ibuf;
  scoped_array<char> ibuf_data;
  bool partial;
  size_t ibufsize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rest_;
  DictionaryInfo *d;
  ostream_wrapper ofs;
  int nbest;
  string ofilename;
  scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl> model;
  Param param;
  value_type *in_stack_fffffffffffff938;
  Param *in_stack_fffffffffffff940;
  ostream *in_stack_fffffffffffff950;
  ostream *in_stack_fffffffffffff958;
  Param *in_stack_fffffffffffff960;
  Param *in_stack_fffffffffffff970;
  char *local_688;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff988;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  Param *in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  Param *in_stack_fffffffffffffa08;
  Param *in_stack_fffffffffffffa28;
  scoped_fixed_array<char,_8192> local_390;
  string local_378 [32];
  istream_wrapper local_358;
  size_type local_348;
  scoped_ptr<MeCab::Tagger> local_340;
  char *local_330;
  scoped_array<char> local_328;
  byte local_315;
  int local_314;
  int local_310 [2];
  ulong local_308;
  allocator local_2f9;
  string local_2f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c0;
  undefined8 *local_2b8;
  ostream_wrapper local_2b0;
  int local_29c;
  string local_298 [32];
  scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl> local_278;
  undefined4 local_268;
  Param local_258;
  int local_10;
  uint local_8;
  int local_4;
  
  local_8 = in_EDI;
  local_10 = in_ESI;
  MeCab::Param::Param(in_stack_fffffffffffff970);
  uVar4 = MeCab::Param::open(&local_258,(char *)(ulong)local_8,local_10,
                             MeCab::(anonymous_namespace)::long_options);
  if ((uVar4 & 1) == 0) {
    pcVar6 = MeCab::Param::what((Param *)0x19ff15);
    poVar7 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_268 = 1;
    goto LAB_001a1388;
  }
  bVar2 = MeCab::Param::get<bool>
                    (in_stack_fffffffffffff9f8,
                     (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  if (bVar2) {
    pcVar6 = MeCab::Param::help((Param *)0x19ffbe);
    poVar7 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_268 = 1;
    goto LAB_001a1388;
  }
  bVar2 = MeCab::Param::get<bool>
                    (in_stack_fffffffffffff9f8,
                     (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  if (bVar2) {
    pcVar6 = MeCab::Param::version((Param *)0x1a004e);
    poVar7 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_268 = 1;
    goto LAB_001a1388;
  }
  bVar2 = MeCab::load_dictionary_resource(in_stack_fffffffffffffa28);
  if (!bVar2) {
    pcVar6 = MeCab::Param::what((Param *)0x1a00d7);
    poVar7 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_268 = 1;
    goto LAB_001a1388;
  }
  iVar5 = MeCab::Param::get<int>
                    (in_stack_fffffffffffff9f8,
                     (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  if (0 < iVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"lattice-level is DEPERCATED. ");
    poVar7 = std::operator<<(poVar7,"use --marginal or --nbest.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  pMVar8 = (ModelImpl *)operator_new(0x30);
  MeCab::anon_unknown_0::ModelImpl::ModelImpl((ModelImpl *)in_stack_fffffffffffff970);
  MeCab::scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::scoped_ptr(&local_278,pMVar8);
  pMVar8 = MeCab::scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::operator->(&local_278);
  uVar4 = MeCab::anon_unknown_0::ModelImpl::open(pMVar8,(char *)&local_258,__oflag);
  if ((uVar4 & 1) != 0) {
    MeCab::Param::get<std::__cxx11::string>
              (in_stack_fffffffffffffa08,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) != 0) {
      std::__cxx11::string::operator=(local_298,"-");
    }
    local_29c = MeCab::Param::get<int>
                          (in_stack_fffffffffffff9f8,
                           (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    if ((0 < local_29c) && (local_29c < 0x201)) {
      std::__cxx11::string::c_str();
      MeCab::ostream_wrapper::ostream_wrapper
                ((ostream_wrapper *)in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958);
      poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
      bVar3 = std::ios::operator!((ios *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18)));
      if ((bVar3 & 1) == 0) {
        bVar2 = MeCab::Param::get<bool>
                          (in_stack_fffffffffffff9f8,
                           (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        if (bVar2) {
          MeCab::ostream_wrapper::operator*(&local_2b0);
          MeCab::Param::dump_config(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
          local_4 = 1;
          local_268 = 1;
        }
        else {
          bVar2 = MeCab::Param::get<bool>
                            (in_stack_fffffffffffff9f8,
                             (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
          if (!bVar2) {
            local_2c0 = MeCab::Param::rest_args_abi_cxx11_(&local_258);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            bVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff950);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2f8,"-",&local_2f9);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
              std::__cxx11::string::~string(local_2f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
            }
            local_310[1] = 0x500000;
            local_310[0] = MeCab::Param::get<int>
                                     (in_stack_fffffffffffff9f8,
                                      (char *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0));
            local_314 = 0x2000;
            piVar11 = std::max<int>(local_310,&local_314);
            piVar11 = std::min<int>(local_310 + 1,piVar11);
            local_308 = (ulong)*piVar11;
            local_315 = MeCab::Param::get<bool>
                                  (in_stack_fffffffffffff9f8,
                                   (char *)CONCAT44(in_stack_fffffffffffff9f4,
                                                    in_stack_fffffffffffff9f0));
            if ((bool)local_315) {
              local_308 = local_308 << 3;
            }
            pcVar6 = (char *)operator_new__(local_308);
            MeCab::scoped_array<char>::scoped_array(&local_328,pcVar6);
            local_330 = MeCab::scoped_array<char>::get(&local_328);
            pMVar8 = MeCab::scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::operator->
                               (&local_278);
            iVar5 = (*(pMVar8->super_Model)._vptr_Model[3])();
            MeCab::scoped_ptr<MeCab::Tagger>::scoped_ptr
                      (&local_340,(Tagger *)CONCAT44(extraout_var_00,iVar5));
            pTVar12 = MeCab::scoped_ptr<MeCab::Tagger>::get(&local_340);
            if (pTVar12 == (Tagger *)0x0) {
              poVar7 = std::operator<<((ostream *)&std::cout,"cannot create tagger");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              local_4 = 1;
              local_268 = 1;
            }
            else {
              local_348 = 0;
              sVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(&local_2d8);
              if (sVar13 != 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_2d8,local_348);
                std::__cxx11::string::c_str();
                MeCab::istream_wrapper::istream_wrapper
                          ((istream_wrapper *)in_stack_fffffffffffff960,
                           (char *)in_stack_fffffffffffff958);
                piVar14 = MeCab::istream_wrapper::operator*(&local_358);
                bVar3 = std::ios::operator!((ios *)(piVar14 + *(long *)(*(long *)piVar14 + -0x18)));
                if ((bVar3 & 1) == 0) {
                  do {
                    if ((local_315 & 1) == 0) {
                      piVar14 = MeCab::istream_wrapper::operator->(&local_358);
                      std::istream::getline((char *)piVar14,(long)local_330);
                    }
                    else {
                      std::__cxx11::string::string(local_378);
                      MeCab::scoped_fixed_array<char,_8192>::scoped_fixed_array
                                ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffff940);
                      while( true ) {
                        piVar14 = MeCab::istream_wrapper::operator->(&local_358);
                        pcVar6 = MeCab::scoped_fixed_array<char,_8192>::get(&local_390);
                        MeCab::scoped_fixed_array<char,_8192>::size(&local_390);
                        plVar16 = (long *)std::istream::getline((char *)piVar14,(long)pcVar6);
                        bVar3 = std::ios::operator!((ios *)((long)plVar16 +
                                                           *(long *)(*plVar16 + -0x18)));
                        if ((bVar3 & 1) != 0) break;
                        pcVar6 = MeCab::scoped_fixed_array<char,_8192>::get(&local_390);
                        std::__cxx11::string::operator+=(local_378,pcVar6);
                        std::__cxx11::string::operator+=(local_378,'\n');
                        pcVar6 = MeCab::scoped_fixed_array<char,_8192>::get(&local_390);
                        iVar5 = strcmp(pcVar6,"EOS");
                        if ((iVar5 == 0) ||
                           (pcVar6 = MeCab::scoped_fixed_array<char,_8192>::operator[](&local_390,0)
                           , *pcVar6 == '\0')) goto LAB_001a0fd4;
                      }
                      piVar14 = MeCab::istream_wrapper::operator->(&local_358);
                      uVar1 = *(undefined8 *)(*(long *)piVar14 + -0x18);
                      std::operator|(_S_eofbit,_S_badbit);
                      std::ios::clear((int)piVar14 + (int)uVar1);
LAB_001a0fd4:
                      pcVar6 = local_330;
                      __src = (char *)std::__cxx11::string::c_str();
                      strncpy(pcVar6,__src,local_308);
                      MeCab::scoped_fixed_array<char,_8192>::~scoped_fixed_array
                                ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffff940);
                      std::__cxx11::string::~string(local_378);
                    }
                    MeCab::istream_wrapper::operator->(&local_358);
                    bVar3 = std::ios::eof();
                    if (((bVar3 & 1) != 0) && (*local_330 == '\0')) {
                      local_4 = 0;
                      goto LAB_001a12a8;
                    }
                    MeCab::istream_wrapper::operator->(&local_358);
                    bVar3 = std::ios::fail();
                    if ((bVar3 & 1) != 0) {
                      poVar7 = std::operator<<((ostream *)&std::cerr,"input-buffer overflow. ");
                      poVar7 = std::operator<<(poVar7,"The line is split. use -b #SIZE option.");
                      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                      piVar14 = MeCab::istream_wrapper::operator->(&local_358);
                      std::ios::clear((int)piVar14 + (int)*(undefined8 *)(*(long *)piVar14 + -0x18))
                      ;
                    }
                    if (local_29c < 2) {
                      pTVar12 = MeCab::scoped_ptr<MeCab::Tagger>::operator->(&local_340);
                      iVar5 = (*pTVar12->_vptr_Tagger[1])(pTVar12,local_330);
                      local_688 = (char *)CONCAT44(extraout_var_02,iVar5);
                    }
                    else {
                      pTVar12 = MeCab::scoped_ptr<MeCab::Tagger>::operator->(&local_340);
                      iVar5 = (*pTVar12->_vptr_Tagger[3])(pTVar12,(long)local_29c,local_330);
                      local_688 = (char *)CONCAT44(extraout_var_01,iVar5);
                    }
                    if (local_688 == (char *)0x0) goto LAB_001a11f4;
                    poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
                    in_stack_fffffffffffff940 = (Param *)std::operator<<(poVar7,local_688);
                    std::ostream::operator<<
                              (in_stack_fffffffffffff940,std::flush<char,std::char_traits<char>>);
                  } while( true );
                }
                poVar7 = std::operator<<((ostream *)&std::cout,"no such file or directory: ");
                pvVar15 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&local_2d8,local_348);
                poVar7 = std::operator<<(poVar7,(string *)pvVar15);
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                local_4 = 1;
                goto LAB_001a12a8;
              }
              local_4 = 0;
              local_268 = 1;
            }
            goto LAB_001a12dc;
          }
          pMVar8 = MeCab::scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::operator->
                             (&local_278);
          iVar5 = (**(pMVar8->super_Model)._vptr_Model)();
          for (local_2b8 = (undefined8 *)CONCAT44(extraout_var,iVar5);
              local_2b8 != (undefined8 *)0x0; local_2b8 = (undefined8 *)local_2b8[5]) {
            poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
            poVar7 = std::operator<<(poVar7,"filename:\t");
            poVar7 = std::operator<<(poVar7,(char *)*local_2b8);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
            poVar7 = std::operator<<(poVar7,"version:\t");
            pvVar10 = (void *)std::ostream::operator<<(poVar7,*(ushort *)(local_2b8 + 4));
            std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
            poVar7 = std::operator<<(poVar7,"charset:\t");
            poVar7 = std::operator<<(poVar7,(char *)local_2b8[1]);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
            poVar7 = std::operator<<(poVar7,"type:\t");
            pvVar10 = (void *)std::ostream::operator<<(poVar7,*(int *)((long)local_2b8 + 0x14));
            std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
            poVar7 = std::operator<<(poVar7,"size:\t");
            pvVar10 = (void *)std::ostream::operator<<(poVar7,*(uint *)(local_2b8 + 2));
            std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
            poVar7 = std::operator<<(poVar7,"left size:\t");
            pvVar10 = (void *)std::ostream::operator<<(poVar7,*(uint *)(local_2b8 + 3));
            std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
            poVar7 = std::operator<<(poVar7,"right size:\t");
            pvVar10 = (void *)std::ostream::operator<<(poVar7,*(uint *)((long)local_2b8 + 0x1c));
            std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            poVar7 = MeCab::ostream_wrapper::operator*(&local_2b0);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          local_4 = 1;
          local_268 = 1;
        }
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"no such file or directory: ");
        poVar7 = std::operator<<(poVar7,local_298);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        local_268 = 1;
      }
      goto LAB_001a132e;
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"invalid N value");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_268 = 1;
    goto LAB_001a134c;
  }
  pcVar6 = MeCab::getLastError();
  poVar7 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  local_4 = 1;
  local_268 = 1;
  goto LAB_001a136a;
LAB_001a11f4:
  pTVar12 = MeCab::scoped_ptr<MeCab::Tagger>::operator->(&local_340);
  iVar5 = (*pTVar12->_vptr_Tagger[0x1b])();
  in_stack_fffffffffffff950 =
       std::operator<<((ostream *)&std::cout,(char *)CONCAT44(extraout_var_03,iVar5));
  std::ostream::operator<<(in_stack_fffffffffffff950,std::endl<char,std::char_traits<char>>);
  local_4 = 1;
LAB_001a12a8:
  local_268 = 1;
  MeCab::istream_wrapper::~istream_wrapper((istream_wrapper *)in_stack_fffffffffffff940);
LAB_001a12dc:
  MeCab::scoped_ptr<MeCab::Tagger>::~scoped_ptr
            ((scoped_ptr<MeCab::Tagger> *)in_stack_fffffffffffff940);
  MeCab::scoped_array<char>::~scoped_array((scoped_array<char> *)in_stack_fffffffffffff940);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff950);
LAB_001a132e:
  MeCab::ostream_wrapper::~ostream_wrapper((ostream_wrapper *)in_stack_fffffffffffff940);
LAB_001a134c:
  std::__cxx11::string::~string(local_298);
LAB_001a136a:
  MeCab::scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::~scoped_ptr
            ((scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl> *)in_stack_fffffffffffff940);
LAB_001a1388:
  MeCab::Param::~Param(in_stack_fffffffffffff940);
  return local_4;
}

Assistant:

int mecab_do(int argc, char **argv) {
#define WHAT_ERROR(msg) do {                    \
    std::cout << msg << std::endl;              \
    return EXIT_FAILURE; }                      \
  while (0);

  MeCab::Param param;
  if (!param.open(argc, argv, MeCab::long_options)) {
    std::cout << param.what() << std::endl;
    return EXIT_FAILURE;
  }

  if (param.get<bool>("help")) {
    std::cout << param.help() << std::endl;
    return EXIT_SUCCESS;
  }

  if (param.get<bool>("version")) {
    std::cout << param.version() << std::endl;
    return EXIT_SUCCESS;
  }

  if (!load_dictionary_resource(&param)) {
    std::cout << param.what() << std::endl;
    return EXIT_SUCCESS;
  }

  if (param.get<int>("lattice-level") >= 1) {
    std::cerr << "lattice-level is DEPERCATED. "
              << "use --marginal or --nbest." << std::endl;
  }

  MeCab::scoped_ptr<MeCab::ModelImpl> model(new MeCab::ModelImpl);
  if (!model->open(param)) {
    std::cout << MeCab::getLastError() << std::endl;
    return EXIT_FAILURE;
  }

  std::string ofilename = param.get<std::string>("output");
  if (ofilename.empty()) {
    ofilename = "-";
  }

  const int nbest = param.get<int>("nbest");
  if (nbest <= 0 || nbest > NBEST_MAX) {
    WHAT_ERROR("invalid N value");
  }

  MeCab::ostream_wrapper ofs(ofilename.c_str());
  if (!*ofs) {
    WHAT_ERROR("no such file or directory: " << ofilename);
  }

  if (param.get<bool>("dump-config")) {
    param.dump_config(&*ofs);
    return EXIT_FAILURE;
  }

  if (param.get<bool>("dictionary-info")) {
    for (const MeCab::DictionaryInfo *d = model->dictionary_info();
         d; d = d->next) {
      *ofs << "filename:\t" << d->filename << std::endl;
      *ofs << "version:\t" << d->version << std::endl;
      *ofs << "charset:\t" << d->charset << std::endl;
      *ofs << "type:\t" << d->type   << std::endl;
      *ofs << "size:\t" << d->size << std::endl;
      *ofs << "left size:\t" << d->lsize << std::endl;
      *ofs << "right size:\t" << d->rsize << std::endl;
      *ofs << std::endl;
    }
    return EXIT_FAILURE;
  }

  const std::vector<std::string>& rest_ = param.rest_args();
  std::vector<std::string> rest = rest_;

  if (rest.empty()) {
    rest.push_back("-");
  }

  size_t ibufsize = std::min(MAX_INPUT_BUFFER_SIZE,
                             std::max(param.get<int>
                                            ("input-buffer-size"),
                                            MIN_INPUT_BUFFER_SIZE));

  const bool partial = param.get<bool>("partial");
  if (partial) {
    ibufsize *= 8;
  }

  MeCab::scoped_array<char> ibuf_data(new char[ibufsize]);
  char *ibuf = ibuf_data.get();

  MeCab::scoped_ptr<MeCab::Tagger> tagger(model->createTagger());

  if (!tagger.get()) {
    WHAT_ERROR("cannot create tagger");
  }

  for (size_t i = 0; i < rest.size(); ++i) {
    MeCab::istream_wrapper ifs(rest[i].c_str());
    if (!*ifs) {
      WHAT_ERROR("no such file or directory: " << rest[i]);
    }

    while (true) {
      if (!partial) {
        ifs->getline(ibuf, ibufsize);
      } else {
        std::string sentence;
        MeCab::scoped_fixed_array<char, BUF_SIZE> line;
        for (;;) {
          if (!ifs->getline(line.get(), line.size())) {
            ifs->clear(std::ios::eofbit|std::ios::badbit);
            break;
          }
          sentence += line.get();
          sentence += '\n';
          if (std::strcmp(line.get(), "EOS") == 0 || line[0] == '\0') {
            break;
          }
        }
        std::strncpy(ibuf, sentence.c_str(), ibufsize);
      }
      if (ifs->eof() && !ibuf[0]) {
        return false;
      }
      if (ifs->fail()) {
        std::cerr << "input-buffer overflow. "
                  << "The line is split. use -b #SIZE option." << std::endl;
        ifs->clear();
      }
      const char *r = (nbest >= 2) ? tagger->parseNBest(nbest, ibuf) :
          tagger->parse(ibuf);
      if (!r)  {
        WHAT_ERROR(tagger->what());
      }
      *ofs << r << std::flush;
    }
  }

  return EXIT_SUCCESS;

#undef WHAT_ERROR
}